

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl,UA_Job **jobs,UA_UInt16 timeout)

{
  size_t *psVar1;
  ServerNetworkLayerTCP *layer;
  int *piVar2;
  UA_Logger logger;
  ulong uVar3;
  undefined8 uVar4;
  UA_UInt32 UVar5;
  UA_UInt32 UVar6;
  UA_UInt32 UVar7;
  UA_Int32 UVar8;
  int iVar9;
  uint sockfd;
  int iVar10;
  UA_StatusCode UVar11;
  void *__ptr;
  UA_Connection *__ptr_00;
  uint *puVar12;
  char *pcVar13;
  ConnectionMapping *pCVar14;
  size_t i;
  ulong uVar15;
  long lVar16;
  size_t i_2;
  size_t sVar17;
  undefined8 *puVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  undefined1 local_178 [8];
  fd_set errset;
  fd_set fdset;
  timeval tmptv;
  socklen_t addrlen;
  int i_1;
  undefined1 auStack_58 [8];
  sockaddr_in addr;
  long local_40;
  
  layer = (ServerNetworkLayerTCP *)nl->handle;
  sVar17 = layer->mappingsSize;
  __ptr = malloc(sVar17 << 6);
  if (__ptr == (void *)0x0) {
    sVar17 = 0x80030000;
  }
  else {
    lVar20 = 0;
    local_40 = 0;
    for (uVar15 = 0; uVar15 < sVar17; uVar15 = uVar15 + 1) {
      pCVar14 = layer->mappings;
      piVar2 = *(int **)((long)&pCVar14->connection + lVar20);
      if ((piVar2 == (int *)0x0) || (*piVar2 == 2)) {
        lVar19 = local_40 * 0x20;
        *(undefined4 *)((long)__ptr + lVar19) = 1;
        *(int **)((long)__ptr + lVar19 + 8) = piVar2;
        uVar4 = *(undefined8 *)&pCVar14[sVar17 - 1].sockfd;
        puVar18 = (undefined8 *)((long)&pCVar14->connection + lVar20);
        *puVar18 = pCVar14[sVar17 - 1].connection;
        puVar18[1] = uVar4;
        sVar17 = layer->mappingsSize - 1;
        layer->mappingsSize = sVar17;
        *(undefined4 *)((long)__ptr + lVar19 + 0x20) = 5;
        *(code **)((long)__ptr + lVar19 + 0x30) = FreeConnectionCallback;
        *(int **)((long)__ptr + lVar19 + 0x28) = piVar2;
        local_40 = local_40 + 2;
      }
      lVar20 = lVar20 + 0x10;
    }
    addr.sin_zero = (uchar  [8])jobs;
    UVar8 = setFDSet(layer,(fd_set *)(errset.fds_bits + 0xf));
    setFDSet(layer,(fd_set *)local_178);
    fdset.fds_bits[0xf] = 0;
    tmptv.tv_sec = (ulong)timeout * 1000;
    iVar9 = select(UVar8 + 1,(fd_set *)(errset.fds_bits + 0xf),(fd_set *)0x0,(fd_set *)local_178,
                   (timeval *)(fdset.fds_bits + 0xf));
    if (iVar9 < 1 && local_40 == 0) {
      free(__ptr);
      *(undefined8 *)addr.sin_zero = 0;
      sVar17 = 0;
    }
    else {
      iVar10 = layer->serversockfd;
      if (((ulong)errset.fds_bits[(long)(iVar10 / 0x40) + 0xf] >> ((long)iVar10 % 0x40 & 0x3fU) & 1)
          != 0) {
        iVar9 = iVar9 + -1;
        sockfd = accept(iVar10,(sockaddr *)0x0,(socklen_t *)0x0);
        if (-1 < (int)sockfd) {
          socket_set_nonblocking(sockfd);
          tmptv.tv_usec._4_4_ = 1;
          setsockopt(sockfd,6,1,(void *)((long)&tmptv.tv_usec + 4),4);
          __ptr_00 = (UA_Connection *)malloc(0x88);
          if (__ptr_00 != (UA_Connection *)0x0) {
            tmptv.tv_usec._0_4_ = 0x10;
            iVar10 = getpeername(sockfd,(sockaddr *)auStack_58,(socklen_t *)&tmptv.tv_usec);
            logger = layer->logger;
            if (iVar10 == 0) {
              pcVar13 = inet_ntoa((in_addr)auStack_58._4_4_);
              UA_LOG_INFO(logger,UA_LOGCATEGORY_NETWORK,
                          "Connection %i | New connection over TCP from %s:%d",(ulong)sockfd,pcVar13
                          ,(ulong)(ushort)(auStack_58._2_2_ << 8 | (ushort)auStack_58._2_2_ >> 8));
            }
            else {
              puVar12 = (uint *)__errno_location();
              UA_LOG_WARNING(logger,UA_LOGCATEGORY_NETWORK,
                             "Connection %i | New connection over TCP, getpeername failed with errno %i"
                             ,(ulong)sockfd,(ulong)*puVar12);
            }
            *(undefined8 *)&__ptr_00->sockfd = 0;
            __ptr_00->handle = (void *)0x0;
            __ptr_00->send = (_func_UA_StatusCode_UA_Connection_ptr_UA_ByteString_ptr *)0x0;
            __ptr_00->recv =
                 (_func_UA_StatusCode_UA_Connection_ptr_UA_ByteString_ptr_UA_UInt32 *)0x0;
            __ptr_00->getSendBuffer =
                 (_func_UA_StatusCode_UA_Connection_ptr_size_t_UA_ByteString_ptr *)0x0;
            __ptr_00->releaseSendBuffer = (_func_void_UA_Connection_ptr_UA_ByteString_ptr *)0x0;
            (__ptr_00->incompleteMessage).length = 0;
            (__ptr_00->incompleteMessage).data = (UA_Byte *)0x0;
            *(undefined8 *)&(__ptr_00->remoteConf).maxChunkCount = 0;
            __ptr_00->channel = (UA_SecureChannel *)0x0;
            __ptr_00->sockfd = sockfd;
            __ptr_00->handle = layer;
            UVar5 = (layer->conf).sendBufferSize;
            UVar6 = (layer->conf).recvBufferSize;
            UVar7 = (layer->conf).maxMessageSize;
            (__ptr_00->localConf).protocolVersion = (layer->conf).protocolVersion;
            (__ptr_00->localConf).sendBufferSize = UVar5;
            (__ptr_00->localConf).recvBufferSize = UVar6;
            (__ptr_00->localConf).maxMessageSize = UVar7;
            (__ptr_00->localConf).maxChunkCount = (layer->conf).maxChunkCount;
            UVar5 = (layer->conf).sendBufferSize;
            UVar6 = (layer->conf).recvBufferSize;
            UVar7 = (layer->conf).maxMessageSize;
            (__ptr_00->remoteConf).protocolVersion = (layer->conf).protocolVersion;
            (__ptr_00->remoteConf).sendBufferSize = UVar5;
            (__ptr_00->remoteConf).recvBufferSize = UVar6;
            (__ptr_00->remoteConf).maxMessageSize = UVar7;
            (__ptr_00->remoteConf).maxChunkCount = (layer->conf).maxChunkCount;
            __ptr_00->send = socket_write;
            __ptr_00->close = ServerNetworkLayerTCP_closeConnection;
            __ptr_00->getSendBuffer = ServerNetworkLayerGetSendBuffer;
            __ptr_00->releaseSendBuffer = ServerNetworkLayerReleaseSendBuffer;
            __ptr_00->releaseRecvBuffer = ServerNetworkLayerReleaseRecvBuffer;
            __ptr_00->state = UA_CONNECTION_OPENING;
            pCVar14 = (ConnectionMapping *)
                      realloc(layer->mappings,layer->mappingsSize * 0x10 + 0x10);
            if (pCVar14 == (ConnectionMapping *)0x0) {
              UA_LOG_ERROR(layer->logger,UA_LOGCATEGORY_NETWORK,"No memory for a new Connection");
              free(__ptr_00);
            }
            else {
              layer->mappings = pCVar14;
              sVar17 = layer->mappingsSize;
              pCVar14[sVar17].connection = __ptr_00;
              pCVar14[sVar17].sockfd = sockfd;
              layer->mappingsSize = sVar17 + 1;
            }
          }
        }
      }
      auStack_58 = (undefined1  [8])0x0;
      addr.sin_family = 0;
      addr.sin_port = 0;
      addr.sin_addr.s_addr = 0;
      lVar20 = 0;
      uVar21 = 0;
      uVar15 = 0;
      while ((uVar15 < layer->mappingsSize && (uVar21 < (ulong)(long)iVar9))) {
        iVar10 = *(int *)((long)&layer->mappings->sockfd + lVar20);
        uVar3 = (long)iVar10 % 0x40;
        lVar19 = (long)(iVar10 / 0x40);
        if ((((ulong)errset.fds_bits[lVar19 + -1] >> (uVar3 & 0x3f) & 1) != 0) ||
           ((errset.fds_bits[lVar19 + 0xf] & 1L << ((byte)uVar3 & 0x3f)) != 0)) {
          UVar11 = socket_recv(*(UA_Connection **)((long)&layer->mappings->connection + lVar20),
                               (UA_ByteString *)auStack_58,0);
          if (UVar11 == 0x80ae0000) {
            lVar19 = *(long *)((long)&layer->mappings->connection + lVar20);
            UA_LOG_INFO(layer->logger,UA_LOGCATEGORY_NETWORK,
                        "Connection %i | Connection closed from remote",
                        (ulong)*(uint *)(lVar19 + 0x38));
            lVar16 = uVar21 * 0x20;
            *(undefined4 *)((long)__ptr + lVar16 + local_40 * 0x20) = 1;
            *(long *)((long)__ptr + lVar16 + 8 + local_40 * 0x20) = lVar19;
            pCVar14 = layer->mappings + (layer->mappingsSize - 1);
            uVar4 = *(undefined8 *)&pCVar14->sockfd;
            puVar18 = (undefined8 *)((long)&layer->mappings->connection + lVar20);
            *puVar18 = pCVar14->connection;
            puVar18[1] = uVar4;
            layer->mappingsSize = layer->mappingsSize - 1;
            local_40 = local_40 + 1;
            *(undefined4 *)((long)__ptr + lVar16 + local_40 * 0x20) = 5;
            *(code **)((long)__ptr + lVar16 + 0x10 + local_40 * 0x20) = FreeConnectionCallback;
            *(long *)((long)__ptr + lVar16 + 8 + local_40 * 0x20) = lVar19;
          }
          else {
            if (UVar11 != 0) goto LAB_00125554;
            lVar19 = uVar21 * 0x20;
            *(undefined8 *)((long)__ptr + lVar19 + 8 + local_40 * 0x20) =
                 *(undefined8 *)((long)&layer->mappings->connection + lVar20);
            psVar1 = (size_t *)((long)__ptr + lVar19 + 0x10 + local_40 * 0x20);
            *psVar1 = (size_t)auStack_58;
            psVar1[1] = addr._0_8_;
            *(undefined4 *)((long)__ptr + lVar19 + local_40 * 0x20) = 2;
          }
          uVar21 = uVar21 + 1;
        }
LAB_00125554:
        uVar15 = uVar15 + 1;
        lVar20 = lVar20 + 0x10;
      }
      sVar17 = uVar21 + local_40;
      if (sVar17 == 0) {
        free(__ptr);
        __ptr = (void *)0x0;
      }
      *(void **)addr.sin_zero = __ptr;
    }
  }
  return sVar17;
}

Assistant:

static size_t
ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl, UA_Job **jobs,
                              UA_UInt16 timeout) {
    /* Every open socket can generate two jobs */
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_Job *js = malloc(sizeof(UA_Job) * (size_t)((layer->mappingsSize * 2)));
    if(!js)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Remove closed sockets */
    size_t totalJobs = removeClosedConnections(layer, js);

    /* Listen on open sockets (including the server) */
    fd_set fdset, errset;
    UA_Int32 highestfd = setFDSet(layer, &fdset);
    setFDSet(layer, &errset);
    struct timeval tmptv = {0, timeout * 1000};
    UA_Int32 resultsize = select(highestfd+1, &fdset, NULL, &errset, &tmptv);
    if(totalJobs == 0 && resultsize <= 0) {
        free(js);
        *jobs = NULL;
        return 0;
    }

    /* Accept new connection via the server socket (can only be a single one) */
    if(UA_fd_isset(layer->serversockfd, &fdset)) {
        --resultsize;
        SOCKET newsockfd = accept((SOCKET)layer->serversockfd, NULL, NULL);
#ifdef _WIN32
        if(newsockfd != INVALID_SOCKET)
#else
        if(newsockfd >= 0)
#endif
        {
            socket_set_nonblocking(newsockfd);
            /* Do not merge packets on the socket (disable Nagle's algorithm) */
            int i = 1;
            setsockopt(newsockfd, IPPROTO_TCP, TCP_NODELAY, (void *)&i, sizeof(i));
            ServerNetworkLayerTCP_add(layer, (UA_Int32)newsockfd);
        }
    }

    /* Read from established sockets */
    UA_ByteString buf = UA_BYTESTRING_NULL;
    size_t j = 0;
    for(size_t i = 0; i < layer->mappingsSize && j < (size_t)resultsize; ++i) {
        if(!UA_fd_isset(layer->mappings[i].sockfd, &errset) &&
           !UA_fd_isset(layer->mappings[i].sockfd, &fdset))
          continue;

        UA_StatusCode retval = socket_recv(layer->mappings[i].connection, &buf, 0);
        if(retval == UA_STATUSCODE_GOOD) {
            js[totalJobs + j].job.binaryMessage.connection = layer->mappings[i].connection;
            js[totalJobs + j].job.binaryMessage.message = buf;
            js[totalJobs + j].type = UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER;
            ++j;
        } else if (retval == UA_STATUSCODE_BADCONNECTIONCLOSED) {
            UA_Connection *c = layer->mappings[i].connection;
            UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                        "Connection %i | Connection closed from remote", c->sockfd);
            /* the socket was closed from remote */
            js[totalJobs + j].type = UA_JOBTYPE_DETACHCONNECTION;
            js[totalJobs + j].job.closeConnection = c;
            layer->mappings[i] = layer->mappings[layer->mappingsSize-1];
            --layer->mappingsSize;
            ++totalJobs; /* increase j only once */
            js[totalJobs + j].type = UA_JOBTYPE_METHODCALL_DELAYED;
            js[totalJobs + j].job.methodCall.method = FreeConnectionCallback;
            js[totalJobs + j].job.methodCall.data = c;
            ++j;
        }
    }
    totalJobs += j;

    if(totalJobs == 0) {
        free(js);
        js = NULL;
    }
    *jobs = js;
    return totalJobs;
}